

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
* __thiscall
chaiscript::eval::Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
::get_arg_type_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
           *__return_storage_ptr__,
          Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>> *this,
          AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node,
          Dispatch_State *t_ss)

{
  long lVar1;
  string_view name;
  Type_Info local_30;
  
  if ((ulong)(*(long *)(this + 0x58) - (long)*(long **)(this + 0x50)) < 9) {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_string_length = 0;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)&(__return_storage_ptr__->second).m_flags = 0x20;
    (__return_storage_ptr__->second).m_type_info = (type_info *)&Type_Info::Unknown_Type::typeinfo;
    (__return_storage_ptr__->second).m_bare_type_info =
         (type_info *)&Type_Info::Unknown_Type::typeinfo;
  }
  else {
    lVar1 = **(long **)(this + 0x50);
    name._M_str = *(char **)(lVar1 + 0x10);
    name._M_len = *(size_t *)(lVar1 + 0x18);
    chaiscript::detail::Dispatch_Engine::get_type
              (&local_30,(Dispatch_Engine *)(t_node->super_AST_Node)._vptr_AST_Node,name,false);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar1 + 0x10));
    (__return_storage_ptr__->second).m_flags = local_30.m_flags;
    *(undefined4 *)&(__return_storage_ptr__->second).field_0x14 = local_30._20_4_;
    (__return_storage_ptr__->second).m_type_info = local_30.m_type_info;
    (__return_storage_ptr__->second).m_bare_type_info = local_30.m_bare_type_info;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::string, Type_Info> get_arg_type(const AST_Node_Impl<T> &t_node, const chaiscript::detail::Dispatch_State &t_ss) {
        if (t_node.children.size() < 2) {
          return {};
        } else {
          return {t_node.children[0]->text, t_ss->get_type(t_node.children[0]->text, false)};
        }
      }